

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

int zt_ptr_array_del(zt_ptr_array *array,void *data)

{
  void *in_RSI;
  zt_ptr_array *in_RDI;
  int32_t i;
  int local_1c;
  
  if ((in_RDI != (zt_ptr_array *)0x0) && (in_RSI != (void *)0x0)) {
    for (local_1c = 0; local_1c < in_RDI->count; local_1c = local_1c + 1) {
      if (in_RDI->array[local_1c] == in_RSI) {
        zt_ptr_array_move_idx_to_idx(in_RDI,in_RDI->count + -1,local_1c);
        in_RDI->count = in_RDI->count + -1;
        if (in_RDI->free_cb != (zt_ptr_array_free_cb)0x0) {
          (*in_RDI->free_cb)(in_RSI);
        }
      }
    }
  }
  return -1;
}

Assistant:

int
zt_ptr_array_del(zt_ptr_array * array, void * data) {
    int32_t i;

    if (array == NULL || data == NULL) {
        return -1;
    }

    for (i = 0; i < array->count; i++) {
        if (array->array[i] == data) {
            zt_ptr_array_move_idx_to_idx(array, array->count - 1, i);
            array->count--;

            if (array->free_cb) {
                array->free_cb(data);
            }
        }
    }

    return -1;
}